

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_storeSolutionReal(SoPlexBase<double> *this,bool verify)

{
  bool bVar1;
  Status SVar2;
  SPxStatus SVar3;
  int iVar4;
  uint uVar5;
  SPxBasisBase<double> *pSVar6;
  VectorBase<double> *pVVar7;
  VarStatus *p_rows;
  SPxSolverBase<double> *vec;
  VarStatus *pVVar8;
  uint uVar9;
  byte in_SIL;
  SoPlexBase<double> *in_RDI;
  double dVar10;
  Real RVar11;
  Verbosity old_verbosity;
  SPxException *E;
  SPxStatus simplifiedBasisStatus;
  undefined8 in_stack_fffffffffffffe78;
  undefined1 initBasis;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe88;
  SPxSimplifier<double> *pSVar12;
  VarStatus *in_stack_fffffffffffffe90;
  undefined1 persistent;
  SPxLPBase<double> *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  undefined8 in_stack_fffffffffffffea8;
  VectorBase<double> *in_stack_fffffffffffffeb0;
  SoPlexBase<double> *in_stack_fffffffffffffec0;
  VectorBase<double> *in_stack_fffffffffffffec8;
  SPxSolverBase<double> *in_stack_fffffffffffffed0;
  SoPlexBase<double> *in_stack_fffffffffffffee0;
  SPxSolverBase<double> *pSVar13;
  undefined4 in_stack_ffffffffffffff28;
  byte local_b9;
  VectorBase<double> *in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 uVar14;
  byte bVar15;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  bool local_59;
  
  pSVar13 = (SPxSolverBase<double> *)&in_RDI->_basisStatusRows;
  numRows((SoPlexBase<double> *)0x45cc02);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  numCols((SoPlexBase<double> *)0x45cc2f);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  initBasis = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x45cc63);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x45cc9d);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x45ccd7);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x45cd11);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
  SVar2 = status(in_RDI);
  local_59 = true;
  if (SVar2 != OPTIMAL) {
    pSVar6 = SPxSolverBase<double>::basis(&in_RDI->_solver);
    SVar3 = SPxBasisBase<double>::status(pSVar6);
    if (SVar3 != PRIMAL) {
      pSVar6 = SPxSolverBase<double>::basis(&in_RDI->_solver);
      SVar3 = SPxBasisBase<double>::status(pSVar6);
      in_stack_ffffffffffffff67 = false;
      local_59 = (bool)in_stack_ffffffffffffff67;
      if (SVar3 != UNBOUNDED) goto LAB_0045cdf3;
    }
    dVar10 = SPxSolverBase<double>::shift(&in_RDI->_solver);
    RVar11 = realParam(in_RDI,EPSILON_ZERO);
    in_stack_ffffffffffffff67 = dVar10 < RVar11 * 10.0;
    local_59 = (bool)in_stack_ffffffffffffff67;
  }
LAB_0045cdf3:
  (in_RDI->_solReal).field_0x98 = (in_RDI->_solReal).field_0x98 & 0xfe | local_59;
  SVar2 = status(in_RDI);
  bVar15 = 0;
  if (SVar2 == UNBOUNDED) {
    bVar15 = in_RDI->_isRealLPLoaded;
  }
  (in_RDI->_solReal).field_0x98 = (in_RDI->_solReal).field_0x98 & 0xfd | (bVar15 & 1) << 1;
  SVar2 = status(in_RDI);
  uVar14 = true;
  if (SVar2 != OPTIMAL) {
    pSVar6 = SPxSolverBase<double>::basis(&in_RDI->_solver);
    SVar3 = SPxBasisBase<double>::status(pSVar6);
    if (SVar3 != DUAL) {
      pSVar6 = SPxSolverBase<double>::basis(&in_RDI->_solver);
      SVar3 = SPxBasisBase<double>::status(pSVar6);
      in_stack_ffffffffffffff55 = false;
      uVar14 = in_stack_ffffffffffffff55;
      if (SVar3 != INFEASIBLE) goto LAB_0045cf3a;
    }
    in_stack_ffffffffffffff48 = (VectorBase<double> *)SPxSolverBase<double>::shift(&in_RDI->_solver)
    ;
    RVar11 = realParam(in_RDI,EPSILON_ZERO);
    in_stack_ffffffffffffff55 = (double)in_stack_ffffffffffffff48 < RVar11 * 10.0;
    uVar14 = in_stack_ffffffffffffff55;
  }
LAB_0045cf3a:
  (in_RDI->_solReal).field_0x98 = (in_RDI->_solReal).field_0x98 & 0xfb | uVar14 << 2;
  SVar2 = status(in_RDI);
  local_b9 = 0;
  if (SVar2 == INFEASIBLE) {
    local_b9 = in_RDI->_isRealLPLoaded;
  }
  (in_RDI->_solReal).field_0x98 = (in_RDI->_solReal).field_0x98 & 0xf7 | (local_b9 & 1) << 3;
  if (((byte)(in_RDI->_solReal).field_0x98 >> 1 & 1) != 0) {
    SPxLPBase<double>::nCols((SPxLPBase<double> *)0x45cff9);
    VectorBase<double>::reDim
              (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
    SPxSolverBase<double>::getPrimalray(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  if (((byte)(in_RDI->_solReal).field_0x98 >> 3 & 1) != 0) {
    SPxLPBase<double>::nRows((SPxLPBase<double> *)0x45d070);
    VectorBase<double>::reDim
              (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
    SPxSolverBase<double>::getDualfarkas(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusRows);
  pVVar7 = (VectorBase<double> *)
           DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusCols);
  iVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(&in_RDI->_basisStatusRows);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(&in_RDI->_basisStatusCols);
  SPxSolverBase<double>::getBasis
            ((SPxSolverBase<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (VarStatus *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88);
  persistent = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  SPxSolverBase<double>::getPrimalSol
            (pSVar13,(VectorBase<double> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  SPxSolverBase<double>::getSlacks
            ((SPxSolverBase<double> *)
             CONCAT17(bVar15,CONCAT16(uVar14,CONCAT15(in_stack_ffffffffffffff55,
                                                      in_stack_ffffffffffffff50))),
             in_stack_ffffffffffffff48);
  SPxSolverBase<double>::getDualSol
            ((SPxSolverBase<double> *)CONCAT44(iVar4,in_stack_ffffffffffffff28),pVVar7);
  SPxSolverBase<double>::getRedCostSol
            ((SPxSolverBase<double> *)
             CONCAT17(bVar15,CONCAT16(uVar14,CONCAT15(in_stack_ffffffffffffff55,
                                                      in_stack_ffffffffffffff50))),
             in_stack_ffffffffffffff48);
  in_RDI->_hasBasis = true;
  SPxSolverBase<double>::forceRecompNonbasicValue(&in_RDI->_solver);
  dVar10 = SPxSolverBase<double>::objValue((SPxSolverBase<double> *)0x45d1f5);
  (in_RDI->_solReal)._objVal = dVar10;
  in_RDI->_hasSolReal = true;
  bVar1 = SPxLPBase<double>::isScaled(&(in_RDI->_solver).super_SPxLPBase<double>);
  if ((bVar1) && ((in_RDI->_isRealLPLoaded & 1U) == 0)) {
    _unscaleSolutionReal
              ((SoPlexBase<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98,(bool)persistent);
  }
  if (in_RDI->_simplifier == (SPxSimplifier<double> *)0x0) {
    if ((SPxSolverBase<double> *)in_RDI->_realLP != &in_RDI->_solver) {
      _loadRealLP((SoPlexBase<double> *)
                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),(bool)initBasis);
    }
  }
  else {
    SPxSolverBase<double>::getBasisStatus((SPxSolverBase<double> *)0x45d272);
    pSVar12 = in_RDI->_simplifier;
    in_stack_fffffffffffffee0 = (SoPlexBase<double> *)&(in_RDI->_solReal)._dual;
    pVVar7 = &(in_RDI->_solReal)._redCost;
    p_rows = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusRows)
    ;
    vec = (SPxSolverBase<double> *)
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusCols);
    SVar2 = status(in_RDI);
    uVar9 = (uint)(SVar2 == OPTIMAL);
    pSVar13 = vec;
    (*pSVar12->_vptr_SPxSimplifier[6])
              (pSVar12,&in_RDI->_solReal,in_stack_fffffffffffffee0,&(in_RDI->_solReal)._slacks,
               pVVar7,p_rows);
    (*in_RDI->_simplifier->_vptr_SPxSimplifier[9])();
    VectorBase<double>::operator=
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe84,uVar9),
               (VectorBase<double> *)vec);
    (*in_RDI->_simplifier->_vptr_SPxSimplifier[0xb])();
    VectorBase<double>::operator=
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe84,uVar9),
               (VectorBase<double> *)vec);
    (*in_RDI->_simplifier->_vptr_SPxSimplifier[10])();
    VectorBase<double>::operator=
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe84,uVar9),
               (VectorBase<double> *)vec);
    (*in_RDI->_simplifier->_vptr_SPxSimplifier[0xc])();
    VectorBase<double>::operator=
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe84,uVar9),
               (VectorBase<double> *)vec);
    SVar3 = (SPxStatus)((ulong)vec >> 0x20);
    pSVar12 = in_RDI->_simplifier;
    pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusRows)
    ;
    in_stack_fffffffffffffe98 =
         (SPxLPBase<double> *)
         DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusCols);
    in_stack_fffffffffffffea4 =
         DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(&in_RDI->_basisStatusRows);
    uVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(&in_RDI->_basisStatusCols);
    (*pSVar12->_vptr_SPxSimplifier[0xf])
              (pSVar12,pVVar8,in_stack_fffffffffffffe98,(ulong)in_stack_fffffffffffffea4,
               (ulong)uVar5);
    persistent = (undefined1)((ulong)pVVar8 >> 0x38);
    _loadRealLP((SoPlexBase<double> *)CONCAT44(in_stack_fffffffffffffe84,uVar9),
                SUB41((uint)SVar3 >> 0x18,0));
    (in_RDI->_solver).weightsAreSetup = false;
    SPxSolverBase<double>::setBasisStatus
              ((SPxSolverBase<double> *)CONCAT44(in_stack_fffffffffffffe84,uVar9),SVar3);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusRows);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusCols);
    SPxSolverBase<double>::setBasis(pSVar13,p_rows,(VarStatus *)pVVar7);
    in_RDI->_hasBasis = true;
  }
  if ((in_RDI->_isRealLPScaled & 1U) != 0) {
    _unscaleSolutionReal
              ((SoPlexBase<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98,(bool)persistent);
  }
  if ((in_SIL & 1) != 0) {
    if (in_RDI->_status == ABORT_VALUE) {
      _verifyObjLimitReal(in_stack_fffffffffffffec0);
    }
    else {
      _verifySolutionReal(in_stack_fffffffffffffee0);
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::_storeSolutionReal(bool verify)
{
   // prepare storage for basis (enough to fit the original basis)
   _basisStatusRows.reSize(numRows());
   _basisStatusCols.reSize(numCols());

   // prepare storage for the solution data (only in transformed space due to unscaling), w/o setting it to zero
   _solReal._primal.reDim(_solver.nCols(), false);
   _solReal._slacks.reDim(_solver.nRows(), false);
   _solReal._dual.reDim(_solver.nRows(), false);
   _solReal._redCost.reDim(_solver.nCols(), false);

   // check primal status consistency and query solution status
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL || status() != SPxSolverBase<R>::ERROR);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_RATIOTESTER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_PRICER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_SOLVER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NOT_INIT);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::SINGULAR);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_PROBLEM);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() != SPxBasisBase<R>::UNBOUNDED
          || status() == SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() == SPxBasisBase<R>::UNBOUNDED
          || _solver.basis().status() == SPxBasisBase<R>::NO_PROBLEM
          || status() != SPxSolverBase<R>::UNBOUNDED);

   _solReal._isPrimalFeasible = (status() == SPxSolverBase<R>::OPTIMAL
                                 || ((_solver.basis().status() == SPxBasisBase<R>::PRIMAL
                                      || _solver.basis().status() == SPxBasisBase<R>::UNBOUNDED)
                                     && _solver.shift() < 10.0 * realParam(SoPlexBase<R>::EPSILON_ZERO)));

   _solReal._hasPrimalRay = (status() == SPxSolverBase<R>::UNBOUNDED && _isRealLPLoaded);

   // check dual status consistency and query solution status
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::ERROR);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_RATIOTESTER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_PRICER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_SOLVER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::NOT_INIT);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::SINGULAR);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_PROBLEM);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() != SPxBasisBase<R>::INFEASIBLE
          || status() == SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() == SPxBasisBase<R>::INFEASIBLE
          || _solver.basis().status() == SPxBasisBase<R>::NO_PROBLEM
          || status() != SPxSolverBase<R>::INFEASIBLE);

   _solReal._isDualFeasible = (status() == SPxSolverBase<R>::OPTIMAL
                               || ((_solver.basis().status() == SPxBasisBase<R>::DUAL
                                    || _solver.basis().status() == SPxBasisBase<R>::INFEASIBLE)
                                   && _solver.shift() < 10.0 * realParam(SoPlexBase<R>::EPSILON_ZERO)));

   _solReal._hasDualFarkas = (status() == SPxSolverBase<R>::INFEASIBLE && _isRealLPLoaded);

   // get infeasibility or unboundedness proof if available
   if(_solReal._hasPrimalRay)
   {
      _solReal._primalRay.reDim(_solver.nCols(), false);
      _solver.getPrimalray(_solReal._primalRay);
   }

   if(_solReal._hasDualFarkas)
   {
      _solReal._dualFarkas.reDim(_solver.nRows(), false);
      _solver.getDualfarkas(_solReal._dualFarkas);
   }

   // get solution data from the solver; independent of solution status
   _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                    _basisStatusRows.size(), _basisStatusCols.size());

   _solver.getPrimalSol(_solReal._primal);
   _solver.getSlacks(_solReal._slacks);
   _solver.getDualSol(_solReal._dual);
   _solver.getRedCostSol(_solReal._redCost);

   _hasBasis = true;

   // get primal and/or dual objective function value depending on status
   _solver.forceRecompNonbasicValue();
   _solReal._objVal = _solver.objValue();

   // infeasible solutions shall also be stored and be accessible
   _hasSolReal = true;

   // unscale vectors
   if(_solver.isScaled() && !_isRealLPLoaded)
      _unscaleSolutionReal(_solver, false);

   // get unsimplified solution data from simplifier
   if(_simplifier)
   {
      assert(!_simplifier->isUnsimplified());
      assert(_simplifier->result() == SPxSimplifier<R>::OKAY);
      assert(_realLP != &_solver);

      typename SPxBasisBase<R>::SPxStatus simplifiedBasisStatus = _solver.getBasisStatus();

      try
      {
         // pass solution data of transformed problem to simplifier
         _simplifier->unsimplify(_solReal._primal, _solReal._dual, _solReal._slacks, _solReal._redCost,
                                 _basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), status() == SPxSolverBase<R>::OPTIMAL);
      }
      catch(const SPxException& E)
      {
         SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() <<
                       "> during unsimplification. Resolving without simplifier and scaler.\n");
         _hasBasis = false;
         _preprocessAndSolveReal(false);
         return;
      }

      // copy unsimplified solution data from simplifier (size and dimension is adapted during copy)
      _solReal._primal  = _simplifier->unsimplifiedPrimal();
      _solReal._slacks  = _simplifier->unsimplifiedSlacks();
      _solReal._dual    = _simplifier->unsimplifiedDual();
      _solReal._redCost = _simplifier->unsimplifiedRedCost();

      // overwrite the transformed basis with the unsimplified one
      _simplifier->getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                            _basisStatusRows.size(), _basisStatusCols.size());

      // load original problem but don't setup a slack basis
      _loadRealLP(false);

      // since we presolved the problem, we should not allow access to the dual norms
      _solver.weightsAreSetup = false;

      assert(_realLP == &_solver);

      // reset basis status
      _solver.setBasisStatus(simplifiedBasisStatus);

      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      // load unsimplified basis into solver
      assert(_basisStatusRows.size() == numRows());
      assert(_basisStatusCols.size() == this->numCols());
      _hasBasis = true;
   }

   // load realLP into the solver again (internal scaling was applied)
   else if(_realLP != &_solver)
   {
      assert(_solver.isScaled());
      _loadRealLP(false);
   }

   // unscale stored solution (removes persistent scaling)
   if(_isRealLPScaled)
      _unscaleSolutionReal(*_realLP, true);

   // check solution for violations and solve again if necessary
   if(verify)
   {
      if(_status == SPxSolverBase<R>::ABORT_VALUE)
         _verifyObjLimitReal();
      else
         _verifySolutionReal();
   }

   assert(_solver.nCols() == this->numCols());
   assert(_solver.nRows() == numRows());
}